

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorExprTree.h
# Opt level: O1

string * __thiscall
phaeton::IdentifierExpr::getName_abi_cxx11_(string *__return_storage_ptr__,IdentifierExpr *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getName() const override { return Name; }